

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O2

int CfdGetSighashTypeFromSchnorrSignature
              (void *handle,char *signature,int *sighash_type,bool *anyone_can_pay)

{
  bool bVar1;
  uint32_t uVar2;
  CfdException *this;
  allocator local_71;
  SigHashType sighash_type_obj;
  SchnorrSignature sig;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(signature);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&sighash_type_obj,signature,&local_71);
    cfd::core::SchnorrSignature::SchnorrSignature(&sig,(string *)&sighash_type_obj);
    std::__cxx11::string::~string((string *)&sighash_type_obj);
    cfd::core::SchnorrSignature::GetSigHashType((SchnorrSignature *)&sighash_type_obj);
    if (sighash_type != (int *)0x0) {
      uVar2 = cfd::core::SigHashType::GetSigHashFlag(&sighash_type_obj);
      *sighash_type = uVar2;
    }
    if (anyone_can_pay != (bool *)0x0) {
      bVar1 = cfd::core::SigHashType::IsAnyoneCanPay(&sighash_type_obj);
      *anyone_can_pay = bVar1;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sig);
    return 0;
  }
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = "cfdcapi_key.cpp";
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish._0_4_ = 0x2e9;
  sig.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = "CfdGetSighashTypeFromSchnorrSignature";
  cfd::core::logger::warn<>((CfdSourceLocation *)&sig,"signature is null or empty.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sig,"Failed to parameter. signature is null or empty.",
             (allocator *)&sighash_type_obj);
  cfd::core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)&sig);
  __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSighashTypeFromSchnorrSignature(
    void* handle, const char* signature, int* sighash_type,
    bool* anyone_can_pay) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(signature)) {
      warn(CFD_LOG_SOURCE, "signature is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. signature is null or empty.");
    }
    SchnorrSignature sig(signature);
    auto sighash_type_obj = sig.GetSigHashType();
    if (sighash_type != nullptr) {
      *sighash_type = static_cast<int>(sighash_type_obj.GetSigHashFlag());
    }
    if (anyone_can_pay != nullptr) {
      *anyone_can_pay = sighash_type_obj.IsAnyoneCanPay();
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}